

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O0

void proto3_arena_unittest::TestPackedTypes::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  TestPackedTypes **v1;
  TestPackedTypes **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  RepeatedField<int> *pRVar2;
  RepeatedField<int> *pRVar3;
  RepeatedField<long> *pRVar4;
  RepeatedField<long> *pRVar5;
  RepeatedField<unsigned_int> *pRVar6;
  RepeatedField<unsigned_int> *pRVar7;
  RepeatedField<unsigned_long> *pRVar8;
  RepeatedField<unsigned_long> *pRVar9;
  RepeatedField<float> *this;
  RepeatedField<float> *other;
  RepeatedField<double> *this_00;
  RepeatedField<double> *other_00;
  RepeatedField<bool> *this_01;
  RepeatedField<bool> *other_01;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  TestPackedTypes *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  TestPackedTypes *from;
  TestPackedTypes *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (TestPackedTypes *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (TestPackedTypes *)to_msg;
  _this = (TestPackedTypes *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto3_arena_unittest::TestPackedTypes_const*>(&local_38);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto3_arena_unittest::TestPackedTypes*>(&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto3_arena_unittest::TestPackedTypes_const*,proto3_arena_unittest::TestPackedTypes*>
                       (v1,v2,"&from != _this");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_arena.pb.cc"
               ,0xf11,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  pRVar2 = _internal_mutable_packed_int32(from);
  pRVar3 = _internal_packed_int32((TestPackedTypes *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar2,pRVar3);
  pRVar4 = _internal_mutable_packed_int64(from);
  pRVar5 = _internal_packed_int64((TestPackedTypes *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedField<long>::MergeFrom(pRVar4,pRVar5);
  pRVar6 = _internal_mutable_packed_uint32(from);
  pRVar7 = _internal_packed_uint32((TestPackedTypes *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedField<unsigned_int>::MergeFrom(pRVar6,pRVar7);
  pRVar8 = _internal_mutable_packed_uint64(from);
  pRVar9 = _internal_packed_uint64((TestPackedTypes *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom(pRVar8,pRVar9);
  pRVar2 = _internal_mutable_packed_sint32(from);
  pRVar3 = _internal_packed_sint32((TestPackedTypes *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar2,pRVar3);
  pRVar4 = _internal_mutable_packed_sint64(from);
  pRVar5 = _internal_packed_sint64((TestPackedTypes *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedField<long>::MergeFrom(pRVar4,pRVar5);
  pRVar6 = _internal_mutable_packed_fixed32(from);
  pRVar7 = _internal_packed_fixed32((TestPackedTypes *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedField<unsigned_int>::MergeFrom(pRVar6,pRVar7);
  pRVar8 = _internal_mutable_packed_fixed64(from);
  pRVar9 = _internal_packed_fixed64((TestPackedTypes *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom(pRVar8,pRVar9);
  pRVar2 = _internal_mutable_packed_sfixed32(from);
  pRVar3 = _internal_packed_sfixed32((TestPackedTypes *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar2,pRVar3);
  pRVar4 = _internal_mutable_packed_sfixed64(from);
  pRVar5 = _internal_packed_sfixed64((TestPackedTypes *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedField<long>::MergeFrom(pRVar4,pRVar5);
  this = _internal_mutable_packed_float(from);
  other = _internal_packed_float((TestPackedTypes *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedField<float>::MergeFrom(this,other);
  this_00 = _internal_mutable_packed_double(from);
  other_00 = _internal_packed_double((TestPackedTypes *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedField<double>::MergeFrom(this_00,other_00);
  this_01 = _internal_mutable_packed_bool(from);
  other_01 = _internal_packed_bool((TestPackedTypes *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedField<bool>::MergeFrom(this_01,other_01);
  pRVar2 = _internal_mutable_packed_enum(from);
  pRVar3 = _internal_packed_enum((TestPackedTypes *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar2,pRVar3);
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)(absl_log_internal_check_op_result + 8));
  return;
}

Assistant:

void TestPackedTypes::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestPackedTypes*>(&to_msg);
  auto& from = static_cast<const TestPackedTypes&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto3_arena_unittest.TestPackedTypes)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_packed_int32()->MergeFrom(from._internal_packed_int32());
  _this->_internal_mutable_packed_int64()->MergeFrom(from._internal_packed_int64());
  _this->_internal_mutable_packed_uint32()->MergeFrom(from._internal_packed_uint32());
  _this->_internal_mutable_packed_uint64()->MergeFrom(from._internal_packed_uint64());
  _this->_internal_mutable_packed_sint32()->MergeFrom(from._internal_packed_sint32());
  _this->_internal_mutable_packed_sint64()->MergeFrom(from._internal_packed_sint64());
  _this->_internal_mutable_packed_fixed32()->MergeFrom(from._internal_packed_fixed32());
  _this->_internal_mutable_packed_fixed64()->MergeFrom(from._internal_packed_fixed64());
  _this->_internal_mutable_packed_sfixed32()->MergeFrom(from._internal_packed_sfixed32());
  _this->_internal_mutable_packed_sfixed64()->MergeFrom(from._internal_packed_sfixed64());
  _this->_internal_mutable_packed_float()->MergeFrom(from._internal_packed_float());
  _this->_internal_mutable_packed_double()->MergeFrom(from._internal_packed_double());
  _this->_internal_mutable_packed_bool()->MergeFrom(from._internal_packed_bool());
  _this->_internal_mutable_packed_enum()->MergeFrom(from._internal_packed_enum());
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}